

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

void __thiscall
afsm::test::TranFSM_RealEventSequence_Test::TestBody(TranFSM_RealEventSequence_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_570;
  Message local_568;
  ready_for_query local_559;
  event_process_result local_558 [2];
  undefined1 local_550 [8];
  AssertionResult gtest_ar_13;
  Message local_538;
  ready_for_query local_529;
  event_process_result local_528 [2];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_12;
  Message local_508;
  command_complete local_4f9;
  event_process_result local_4f8 [2];
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_11;
  Message local_4d8;
  row_event local_4c9;
  event_process_result local_4c8 [2];
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_10;
  Message local_4a8;
  row_event local_499;
  event_process_result local_498 [2];
  undefined1 local_490 [8];
  AssertionResult gtest_ar_9;
  Message local_478;
  row_description local_469;
  event_process_result local_468 [2];
  undefined1 local_460 [8];
  AssertionResult gtest_ar_8;
  Message local_448;
  ready_for_query local_439;
  event_process_result local_438 [2];
  undefined1 local_430 [8];
  AssertionResult gtest_ar_7;
  Message local_418;
  command_complete local_409;
  event_process_result local_408 [2];
  undefined1 local_400 [8];
  AssertionResult gtest_ar_6;
  Message local_3e8;
  commit local_3d9;
  event_process_result local_3d8 [2];
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_5;
  Message local_3b8;
  execute local_3a9;
  event_process_result local_3a8 [2];
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_4;
  Message local_388;
  begin local_379;
  event_process_result local_378 [2];
  undefined1 local_370 [8];
  AssertionResult gtest_ar_3;
  Message local_358;
  ready_for_query local_349;
  event_process_result local_348 [2];
  undefined1 local_340 [8];
  AssertionResult gtest_ar_2;
  Message local_328;
  complete local_319;
  event_process_result local_318 [2];
  undefined1 local_310 [8];
  AssertionResult gtest_ar_1;
  Message local_2f8;
  connect local_2e9;
  event_process_result local_2e8 [2];
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar;
  undefined1 local_2c0 [8];
  connection_fsm fsm;
  TranFSM_RealEventSequence_Test *this_local;
  
  fsm.deferred_event_ids_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   *)local_2c0);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[19]>
            ((observer_wrapper<afsm::test::test_fsm_observer> *)
             ((long)&fsm.
                     super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     .super_type.
                     super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     .
                     super_transition_container<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     .
                     super_transition_container<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>,_false>
                     .transitions_ + 0x158),(char (*) [19])"connection_fsm_def");
  local_2e8[1] = 3;
  local_2e8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::connect>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_2e9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_2e0,"event_process_result::process",
             "fsm.process_event(events::connect{})",local_2e8 + 1,local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_318[1] = 3;
  local_318[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::complete>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_319);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_310,"event_process_result::process",
             "fsm.process_event(events::complete{})",local_318 + 1,local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_348[1] = 3;
  local_348[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_349);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_340,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_348 + 1,local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_378[1] = 3;
  local_378[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::begin>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_379);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_370,"event_process_result::process",
             "fsm.process_event(events::begin{})",local_378 + 1,local_378);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_3a8[1] = 1;
  local_3a8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::execute>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_3a9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_3a0,"event_process_result::defer",
             "fsm.process_event(events::execute{})",local_3a8 + 1,local_3a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3d8[1] = 1;
  local_3d8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::commit>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_3d9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_3d0,"event_process_result::defer",
             "fsm.process_event(events::commit{})",local_3d8 + 1,local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  local_408[1] = 2;
  local_408[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::command_complete>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_409);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_400,"event_process_result::process_in_state",
             "fsm.process_event(events::command_complete{})",local_408 + 1,local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  local_438[1] = 3;
  local_438[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_439);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_430,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_438 + 1,local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_468[1] = 3;
  local_468[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_description>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_469);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_460,"event_process_result::process",
             "fsm.process_event(events::row_description{})",local_468 + 1,local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  local_498[1] = 2;
  local_498[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_event>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_499);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_490,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",local_498 + 1,local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_4c8[1] = 2;
  local_4c8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_event>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_4c9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_4c0,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",local_4c8 + 1,local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,499,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_4f8[1] = 3;
  local_4f8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::command_complete>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_4f9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_4f0,"event_process_result::process",
             "fsm.process_event(events::command_complete{})",local_4f8 + 1,local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,500,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  local_528[1] = 3;
  local_528[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_529);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_520,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_528 + 1,local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_538);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_558[1] = 3;
  local_558[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_559);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_550,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_558 + 1,local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
    testing::internal::AssertHelper::AssertHelper
              (&local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1f7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_570,&local_568);
    testing::internal::AssertHelper::~AssertHelper(&local_570);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                    *)local_2c0);
  return;
}

Assistant:

TEST(TranFSM, RealEventSequence)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    // Connect response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    // Enqueueing commands
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::begin{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::execute{}));
    EXPECT_EQ(event_process_result::defer, fsm.process_event(events::commit{}));

    // Server responses
    // Begin
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Simple query responses
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // Commit response
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
}